

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskBuilder.cpp
# Opt level: O0

int __thiscall
DiskBuilder::LoadDisk
          (DiskBuilder *this,char *file_path,IDisk **created_disk,ILoadingProgress *loading_progress
          )

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference ppFVar4;
  __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
  local_40;
  __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
  local_38;
  iterator it;
  ILoadingProgress *loading_progress_local;
  IDisk **created_disk_local;
  char *file_path_local;
  DiskBuilder *this_local;
  
  it._M_current = (FormatType **)loading_progress;
  local_38._M_current =
       (FormatType **)
       std::vector<FormatType_*,_std::allocator<FormatType_*>_>::begin(&this->format_list_);
  while( true ) {
    local_40._M_current =
         (FormatType **)
         std::vector<FormatType_*,_std::allocator<FormatType_*>_>::end(&this->format_list_);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) {
      return -1;
    }
    ppFVar4 = __gnu_cxx::
              __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
              ::operator*(&local_38);
    uVar2 = (*(*ppFVar4)->_vptr_FormatType[5])();
    if ((uVar2 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>::
    operator++(&local_38,0);
  }
  ppFVar4 = __gnu_cxx::
            __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
            ::operator*(&local_38);
  iVar3 = (*(*ppFVar4)->_vptr_FormatType[6])(*ppFVar4,file_path,created_disk,it._M_current);
  return iVar3;
}

Assistant:

int DiskBuilder::LoadDisk(const char* file_path, IDisk*& created_disk, ILoadingProgress* loading_progress)
{
   // Select correct builder
   for (auto it = format_list_.begin(); it != format_list_.end(); it++)
   {
      if ((*it)->CanLoad(file_path))
      {
         return (*it)->LoadDisk(file_path, created_disk, loading_progress);
      }
   }

   // Nobody can load this file
   return -1;
}